

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

Expression * __thiscall MathInterpreter::fromStringToExpression(MathInterpreter *this)

{
  bool bVar1;
  reference pvVar2;
  char *__nptr;
  undefined8 *puVar3;
  mapped_type *ppVVar4;
  Expression *pEVar5;
  double value_arg;
  double value_arg_00;
  string local_d0;
  _Self local_b0;
  _Self local_a8;
  string local_a0;
  undefined4 local_7c;
  string local_78;
  Expression *local_48;
  Expression *left;
  Expression *right;
  string temp;
  MathInterpreter *this_local;
  
  temp.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&right);
  pvVar2 = std::
           deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(this->postfix_expression);
  std::__cxx11::string::operator=((string *)&right,(string *)pvVar2);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(this->postfix_expression);
  std::__cxx11::string::string((string *)&local_78,(string *)&right);
  bVar1 = isNumber(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar1) {
    this_local = (MathInterpreter *)operator_new(0x10);
    __nptr = (char *)std::__cxx11::string::c_str();
    value_arg = atof(__nptr);
    Value::Value((Value *)this_local,value_arg);
  }
  else {
    std::__cxx11::string::string((string *)&local_a0,(string *)&right);
    bVar1 = isVariable(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      local_a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
           ::find(this->variables,(key_type *)&right);
      local_b0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
           ::end(this->variables);
      bVar1 = std::operator==(&local_a8,&local_b0);
      if (bVar1) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "illegal use of variable!";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
      this_local = (MathInterpreter *)operator_new(0x70);
      std::__cxx11::string::string((string *)&local_d0,(string *)&right);
      ppVVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
                ::at(this->variables,(key_type *)&right);
      (**((*ppVVar4)->super_Expression)._vptr_Expression)();
      Variable::Variable((Variable *)this_local,&local_d0,value_arg_00);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &right,"@");
      if (bVar1) {
        this_local = (MathInterpreter *)operator_new(0x10);
        pEVar5 = fromStringToExpression(this);
        UPlus::UPlus((UPlus *)this_local,pEVar5);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&right,"$");
        if (bVar1) {
          this_local = (MathInterpreter *)operator_new(0x10);
          pEVar5 = fromStringToExpression(this);
          UMinus::UMinus((UMinus *)this_local,pEVar5);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&right,"+");
          if (bVar1) {
            left = fromStringToExpression(this);
            local_48 = fromStringToExpression(this);
            this_local = (MathInterpreter *)operator_new(0x18);
            Plus::Plus((Plus *)this_local,local_48,left);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&right,"-");
            if (bVar1) {
              left = fromStringToExpression(this);
              local_48 = fromStringToExpression(this);
              this_local = (MathInterpreter *)operator_new(0x18);
              Minus::Minus((Minus *)this_local,local_48,left);
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&right,"*");
              if (bVar1) {
                left = fromStringToExpression(this);
                local_48 = fromStringToExpression(this);
                this_local = (MathInterpreter *)operator_new(0x18);
                Mul::Mul((Mul *)this_local,local_48,left);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&right,"/");
                if (bVar1) {
                  left = fromStringToExpression(this);
                  local_48 = fromStringToExpression(this);
                  this_local = (MathInterpreter *)operator_new(0x18);
                  Div::Div((Div *)this_local,local_48,left);
                }
                else {
                  this_local = (MathInterpreter *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  local_7c = 1;
  std::__cxx11::string::~string((string *)&right);
  return (Expression *)this_local;
}

Assistant:

Expression *MathInterpreter::fromStringToExpression() {
  string temp;
  Expression *right, *left;
  temp = this->postfix_expression->back();
  this->postfix_expression->pop_back();
  if (isNumber(temp)) {
    return new Value(atof(temp.c_str()));
  } else if (isVariable(temp)) {
    if (this->variables->find(temp) == this->variables->end()) {
      throw ("illegal use of variable!");
    }
    return new Variable(temp, this->variables->at(temp)->calculate());
  } else if (temp == "@") {
    return new UPlus(fromStringToExpression());
  } else if (temp == "$") {
    return new UMinus(fromStringToExpression());
  } else if (temp == "+") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Plus(left, right);
  } else if (temp == "-") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Minus(left, right);
  } else if (temp == "*") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Mul(left, right);
  } else if (temp == "/") {
    right = fromStringToExpression();
    left = fromStringToExpression();
    return new Div(left, right);
  }
  return nullptr;
}